

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string *filename,int fd)

{
  string *this_00;
  bool bVar1;
  ulong uVar2;
  long lVar3;
  Slice local_40;
  Slice local_30;
  
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_00135c00;
  this->pos_ = 0;
  this->fd_ = fd;
  uVar2 = std::__cxx11::string::rfind((char)filename,0x2f);
  if (uVar2 == 0xffffffffffffffff) {
    local_40.data_ = (filename->_M_dataplus)._M_p;
    local_40.size_ = filename->_M_string_length;
  }
  else {
    lVar3 = std::__cxx11::string::find((char)filename,0x2f);
    if (lVar3 != -1) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                    ,0x1a2,
                    "static Slice leveldb::(anonymous namespace)::PosixWritableFile::Basename(const std::string &)"
                   );
    }
    local_40.data_ = (filename->_M_dataplus)._M_p + uVar2 + 1;
    local_40.size_ = ~uVar2 + filename->_M_string_length;
  }
  local_30.data_ = "MANIFEST";
  local_30.size_ = 8;
  bVar1 = Slice::starts_with(&local_40,&local_30);
  this->is_manifest_ = bVar1;
  this_00 = &this->filename_;
  std::__cxx11::string::string((string *)this_00,(string *)filename);
  lVar3 = std::__cxx11::string::rfind((char)this_00,0x2f);
  if (lVar3 == -1) {
    std::__cxx11::string::string((string *)&this->dirname_,".",(allocator *)&local_40);
  }
  else {
    lVar3 = std::__cxx11::string::find((char)this_00,0x2f);
    if (lVar3 != -1) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                    ,0x192,
                    "static std::string leveldb::(anonymous namespace)::PosixWritableFile::Dirname(const std::string &)"
                   );
    }
    std::__cxx11::string::substr((ulong)&this->dirname_,(ulong)this_00);
  }
  return;
}

Assistant:

PosixWritableFile(std::string filename, int fd)
      : pos_(0),
        fd_(fd),
        is_manifest_(IsManifest(filename)),
        filename_(std::move(filename)),
        dirname_(Dirname(filename_)) {}